

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall gnuplotio::PlotData::~PlotData(PlotData *this)

{
  std::__cxx11::string::~string((string *)&this->bin_size);
  std::__cxx11::string::~string((string *)&this->bin_fmt);
  std::__cxx11::string::~string((string *)&this->arr_or_rec);
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::string::~string((string *)&this->data);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PlotData() { }